

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-reduce.cpp
# Opt level: O2

bool __thiscall
Reducer::shrinkByReduction<wasm::ElementSegment>(Reducer *this,ElementSegment *segment,size_t bonus)

{
  bool bVar1;
  bool bVar2;
  ulong uVar3;
  ostream *poVar4;
  long lVar5;
  ulong uVar6;
  bool bVar7;
  undefined1 local_68 [8];
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> save;
  ulong local_38;
  
  uVar6 = 0;
  local_38 = 1;
  bVar2 = false;
  save.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)bonus;
  do {
    lVar5 = *(long *)(segment + 0x40) - *(long *)(segment + 0x38);
    bVar7 = (ulong)(lVar5 >> 3) <= uVar6;
    bVar1 = bVar7 || lVar5 == 0;
    if (bVar7 || lVar5 == 0) {
      return bVar1;
    }
    if ((bVar2) ||
       (bVar2 = shouldTryToReduce(this,(size_t)save.
                                               super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                               ._M_impl.super__Vector_impl_data._M_end_of_storage),
       bVar2)) {
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
                ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)local_68,
                 (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)(segment + 0x38)
                );
      uVar3 = local_38;
      while ((bVar2 = uVar3 != 0, uVar3 = uVar3 - 1, bVar2 &&
             (*(long *)(segment + 0x38) != *(long *)(segment + 0x40)))) {
        *(long *)(segment + 0x40) = *(long *)(segment + 0x40) + -8;
      }
      bVar7 = writeAndTestReduction(this);
      if (bVar7) {
        poVar4 = std::operator<<((ostream *)&std::cerr,"|      shrank segment from ");
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
        poVar4 = std::operator<<(poVar4," => ");
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
        poVar4 = std::operator<<(poVar4," (skip: ");
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
        std::operator<<(poVar4,")\n");
        noteReduction(this,1);
        local_38 = local_38 * 2;
        if ((ulong)(long)this->factor <= local_38) {
          local_38 = (long)this->factor;
        }
      }
      else {
        std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::_M_move_assign
                  ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                   (segment + 0x38),local_68);
      }
      std::_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~_Vector_base
                ((_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)local_68);
      bVar2 = true;
      if (!bVar7) {
        return bVar1;
      }
    }
    else {
      bVar2 = false;
    }
    uVar6 = uVar6 + 1;
  } while( true );
}

Assistant:

bool shrinkByReduction(T* segment, size_t bonus) {
    // try to reduce to first function. first, shrink segment elements.
    // while we are shrinking successfully, keep going exponentially.
    bool justShrank = false;

    auto& data = segment->data;
    // when we succeed, try to shrink by more and more, similar to bisection
    size_t skip = 1;
    for (size_t i = 0; i < data.size() && !data.empty(); i++) {
      if (justShrank || shouldTryToReduce(bonus)) {
        auto save = data;
        for (size_t j = 0; j < skip; j++) {
          if (data.empty()) {
            break;
          } else {
            data.pop_back();
          }
        }
        justShrank = writeAndTestReduction();
        if (justShrank) {
          std::cerr << "|      shrank segment from " << save.size() << " => "
                    << data.size() << " (skip: " << skip << ")\n";
          noteReduction();
          skip = std::min(size_t(factor), 2 * skip);
        } else {
          data = std::move(save);
          return false;
        }
      }
    }

    return true;
  }